

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_random(mbedtls_mpi *X,mbedtls_mpi_sint min,mbedtls_mpi *N,
                      _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *N_local;
  mbedtls_mpi_sint min_local;
  mbedtls_mpi *X_local;
  
  if (min < 0) {
    X_local._4_4_ = -4;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(N,min);
    if (iVar1 < 1) {
      X_local._4_4_ = -4;
    }
    else {
      X_local._4_4_ = mbedtls_mpi_resize_clear(X,(ulong)N->n);
      if (X_local._4_4_ == 0) {
        X_local._4_4_ = mbedtls_mpi_core_random(X->p,min,N->p,(ulong)X->n,f_rng,p_rng);
      }
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_random(mbedtls_mpi *X,
                       mbedtls_mpi_sint min,
                       const mbedtls_mpi *N,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng)
{
    if (min < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }
    if (mbedtls_mpi_cmp_int(N, min) <= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /* Ensure that target MPI has exactly the same number of limbs
     * as the upper bound, even if the upper bound has leading zeros.
     * This is necessary for mbedtls_mpi_core_random. */
    int ret = mbedtls_mpi_resize_clear(X, N->n);
    if (ret != 0) {
        return ret;
    }

    return mbedtls_mpi_core_random(X->p, min, N->p, X->n, f_rng, p_rng);
}